

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O0

string * __thiscall
C3DFile::getParamString_abi_cxx11_(string *__return_storage_ptr__,C3DFile *this,char *id_str)

{
  bool bVar1;
  int local_d4;
  int i;
  ParameterInfo local_c0;
  undefined1 local_70 [8];
  ParameterInfo param_info;
  char *id_str_local;
  C3DFile *this_local;
  string *result;
  
  param_info._72_8_ = id_str;
  ParameterInfo::ParameterInfo((ParameterInfo *)local_70);
  getParamInfo(&local_c0,this,(char *)param_info._72_8_);
  ParameterInfo::operator=((ParameterInfo *)local_70,&local_c0);
  ParameterInfo::~ParameterInfo(&local_c0);
  if (param_info.name._3_1_ != '\x01') {
    __assert_fail("param_info.n_dimensions == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x6d,"std::string C3DFile::getParamString(const char *)");
  }
  bVar1 = check_param_type<char>(param_info.name._2_1_);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    for (local_d4 = 0; local_d4 < (int)(uint)*(byte *)param_info._16_8_; local_d4 = local_d4 + 1) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,param_info.dimensions[local_d4]);
    }
    ParameterInfo::~ParameterInfo((ParameterInfo *)local_70);
    return __return_storage_ptr__;
  }
  __assert_fail("check_param_type<char>(param_info.data_type)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x6e,"std::string C3DFile::getParamString(const char *)");
}

Assistant:

std::string C3DFile::getParamString(const char* id_str) {
	ParameterInfo param_info;

	param_info = getParamInfo(id_str);

	assert (param_info.n_dimensions == 1);
	assert (check_param_type<char>(param_info.data_type));

	std::string result;

	int i;
	for (i = 0; i < param_info.dimensions[0]; i++)
		result += param_info.char_data[i];

	return result;
}